

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> *b
                    )

{
  ArrayOptions *pAVar1;
  __atomic_base<int> _Var2;
  QAbstractConcatenable *pQVar3;
  QString *pQVar4;
  QChar *pQVar5;
  Data *pDVar6;
  QChar *in_RCX;
  long lVar7;
  char16_t *pcVar8;
  long lVar9;
  QChar *alloc;
  char16_t *pcVar10;
  QLatin1StringView in;
  QLatin1StringView in_00;
  
  lVar7 = (a->d).size;
  pDVar6 = (a->d).d;
  alloc = (QChar *)((b->a).a.m_size + lVar7 + (((b->a).b)->d).size + (b->b).m_size);
  if ((pDVar6 == (Data *)0x0) ||
     (_Var2._M_i = (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i,
     in_RCX = (QChar *)(ulong)(uint)_Var2._M_i, 1 < _Var2._M_i)) {
    QString::reallocData(a,lVar7,KeepSize);
    pDVar6 = (a->d).d;
    if (pDVar6 != (Data *)0x0) goto LAB_003d780a;
    if (0 < (long)alloc) {
      in_RCX = (QChar *)(a->d).size;
      goto LAB_003d785f;
    }
  }
  else {
LAB_003d780a:
    lVar7 = (pDVar6->super_QArrayData).alloc;
    in_RCX = (QChar *)(a->d).size;
    lVar9 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar7 - (long)in_RCX) - lVar9 < (long)alloc) {
      pQVar5 = (QChar *)(lVar7 * 2);
      if (lVar7 * 2 < (long)alloc) {
        pQVar5 = alloc;
      }
      alloc = pQVar5;
      if ((1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar7 - lVar9 <= (long)alloc)) {
LAB_003d785f:
        if ((long)alloc < (long)in_RCX) {
          alloc = in_RCX;
        }
        QString::reallocData(a,(qsizetype)alloc,KeepSize);
        pDVar6 = (a->d).d;
        if (pDVar6 == (Data *)0x0) goto LAB_003d788f;
        lVar7 = (pDVar6->super_QArrayData).alloc;
      }
      if (lVar7 != 0) {
        pAVar1 = &(pDVar6->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_003d78a0;
  }
LAB_003d788f:
  QString::reallocData(a,(a->d).size,KeepSize);
LAB_003d78a0:
  pcVar10 = (a->d).ptr + (a->d).size;
  pQVar3 = (QAbstractConcatenable *)(b->a).a.m_size;
  in.m_data = (char *)pcVar10;
  in.m_size = (qsizetype)(b->a).a.m_data;
  QAbstractConcatenable::appendLatin1To(pQVar3,in,in_RCX);
  pcVar10 = pcVar10 + (long)pQVar3;
  pQVar4 = (b->a).b;
  lVar7 = (pQVar4->d).size;
  if (lVar7 != 0) {
    pcVar8 = (pQVar4->d).ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = &QString::_empty;
    }
    memcpy(pcVar10,pcVar8,lVar7 * 2);
  }
  pQVar3 = (QAbstractConcatenable *)(b->b).m_size;
  in_00.m_data = (char *)(pcVar10 + lVar7);
  in_00.m_size = (qsizetype)(b->b).m_data;
  QAbstractConcatenable::appendLatin1To(pQVar3,in_00,in_RCX);
  pcVar8 = (a->d).ptr;
  if (pcVar8 == (char16_t *)0x0) {
    pcVar8 = &QString::_empty;
  }
  QString::resize(a,(long)(pcVar10 + lVar7) + ((long)pQVar3 * 2 - (long)pcVar8) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}